

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
emplace_back<slang::ast::Expression_const&>
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,Expression *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  ulong uVar4;
  pointer p;
  Expression *pEVar5;
  Expression *pEVar6;
  pointer paVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer pAVar11;
  pointer pAVar12;
  undefined4 uVar13;
  pointer pAVar14;
  long lVar15;
  pointer __src;
  ulong uVar16;
  long lVar17;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    __src->expr = args;
    __src->condition = (Expression *)0x0;
    __src->edge = None;
    (__src->edgeDescriptors)._M_ptr = (pointer)0x0;
    (__src->edgeDescriptors)._M_extent._M_extent_value = 0;
    sVar3 = this->len;
    this->len = sVar3 + 1;
    return this->data_ + sVar3;
  }
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar4 = this->cap;
  if (uVar16 < uVar4 * 2) {
    uVar16 = uVar4 * 2;
  }
  if (0x333333333333333 - uVar4 < uVar4) {
    uVar16 = 0x333333333333333;
  }
  lVar17 = (long)__src - (long)this->data_;
  pAVar14 = (pointer)operator_new(uVar16 * 0x28);
  *(Expression **)((long)pAVar14 + lVar17) = args;
  *(undefined8 *)((long)pAVar14 + lVar17 + 8) = 0;
  *(undefined4 *)((long)pAVar14 + lVar17 + 0x10) = 0;
  puVar1 = (undefined8 *)((long)pAVar14 + lVar17 + 0x18);
  *puVar1 = 0;
  puVar1[1] = 0;
  p = this->data_;
  sVar3 = this->len;
  lVar15 = (long)p + (sVar3 * 0x28 - (long)__src);
  pAVar11 = p;
  pAVar12 = pAVar14;
  if (lVar15 == 0) {
    if (sVar3 != 0) {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)&(pAVar14->edgeDescriptors)._M_extent._M_extent_value + lVar15) =
             *(undefined8 *)((long)&(p->edgeDescriptors)._M_extent._M_extent_value + lVar15);
        puVar1 = (undefined8 *)((long)&p->expr + lVar15);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)((long)&p->edge + lVar15);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pAVar14->edge + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar1 = (undefined8 *)((long)&pAVar14->expr + lVar15);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        lVar15 = lVar15 + 0x28;
      } while (sVar3 * 0x28 != lVar15);
    }
  }
  else {
    for (; pAVar11 != __src; pAVar11 = pAVar11 + 1) {
      (pAVar12->edgeDescriptors)._M_extent._M_extent_value =
           (pAVar11->edgeDescriptors)._M_extent._M_extent_value;
      pEVar5 = pAVar11->expr;
      pEVar6 = pAVar11->condition;
      uVar13 = *(undefined4 *)&pAVar11->field_0x14;
      paVar7 = (pAVar11->edgeDescriptors)._M_ptr;
      pAVar12->edge = pAVar11->edge;
      *(undefined4 *)&pAVar12->field_0x14 = uVar13;
      (pAVar12->edgeDescriptors)._M_ptr = paVar7;
      pAVar12->expr = pEVar5;
      pAVar12->condition = pEVar6;
      pAVar12 = pAVar12 + 1;
    }
    memcpy((void *)((long)pAVar14 + lVar17 + 0x28),__src,((lVar15 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pAVar14;
  return (reference)((long)pAVar14 + lVar17);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }